

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

bool __thiscall
GEO::SystemEnvironment::get_local_value(SystemEnvironment *this,string *name,string *value)

{
  char *pcVar1;
  allocator local_49;
  string local_48 [32];
  char *local_28;
  char *result;
  string *value_local;
  string *name_local;
  SystemEnvironment *this_local;
  
  result = (char *)value;
  value_local = name;
  name_local = (string *)this;
  pcVar1 = (char *)std::__cxx11::string::c_str();
  pcVar1 = getenv(pcVar1);
  local_28 = pcVar1;
  if (pcVar1 != (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,pcVar1,&local_49);
    std::__cxx11::string::operator=((string *)result,local_48);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
  }
  return local_28 != (char *)0x0;
}

Assistant:

bool SystemEnvironment::get_local_value(
        const std::string& name, std::string& value
    ) const {
        // For the moment, deactivated under Windows
#ifdef GEO_OS_WINDOWS
        geo_argused(name);
        geo_argused(value);
        return false;
#else
        char* result = ::getenv(name.c_str());
        if(result != nullptr) {
            value = std::string(result);
        }
        return result != nullptr;
#endif
    }